

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

uint __thiscall
lzham::symbol_codec::decode(symbol_codec *this,adaptive_bit_model *model,bool update_model)

{
  uint uVar1;
  uint uVar2;
  undefined1 in_DL;
  ushort *in_RSI;
  long in_RDI;
  uint bit;
  uint x;
  uint c;
  uint in_stack_ffffffffffffffe4;
  uint in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar3;
  
  uVar3 = CONCAT13(in_DL,in_stack_ffffffffffffffec) & 0x1ffffff;
  while (*(uint *)(in_RDI + 0x84) < 0x1000000) {
    in_stack_ffffffffffffffe8 =
         get_bits((symbol_codec *)CONCAT44(uVar3,in_stack_ffffffffffffffe8),
                  in_stack_ffffffffffffffe4);
    *(uint *)(in_RDI + 0x80) = *(int *)(in_RDI + 0x80) << 8 | in_stack_ffffffffffffffe8;
    *(int *)(in_RDI + 0x84) = *(int *)(in_RDI + 0x84) << 8;
  }
  uVar2 = (uint)*in_RSI * (*(uint *)(in_RDI + 0x84) >> 0xb);
  uVar1 = (uint)(uVar2 <= *(uint *)(in_RDI + 0x80));
  if (uVar1 == 0) {
    if ((uVar3 & 0x1000000) != 0) {
      *in_RSI = *in_RSI + (short)(0x800 - *in_RSI >> 5);
    }
    *(uint *)(in_RDI + 0x84) = uVar2;
  }
  else {
    if ((uVar3 & 0x1000000) != 0) {
      *in_RSI = *in_RSI - (short)((int)(uint)*in_RSI >> 5);
    }
    *(uint *)(in_RDI + 0x80) = *(int *)(in_RDI + 0x80) - uVar2;
    *(uint *)(in_RDI + 0x84) = *(int *)(in_RDI + 0x84) - uVar2;
  }
  return uVar1;
}

Assistant:

uint symbol_codec::decode(adaptive_bit_model& model, bool update_model)
   {
      while (m_arith_length < cSymbolCodecArithMinLen)
      {
         uint c = get_bits(8);
         m_arith_value = (m_arith_value << 8) | c;
         m_arith_length <<= 8;
      }

      uint x = model.m_bit_0_prob * (m_arith_length >> cSymbolCodecArithProbBits);
      uint bit = (m_arith_value >= x);

      if (!bit)
      {
         if (update_model)
            model.m_bit_0_prob += ((cSymbolCodecArithProbScale - model.m_bit_0_prob) >> cSymbolCodecArithProbMoveBits);

         m_arith_length = x;
      }
      else
      {
         if (update_model)
            model.m_bit_0_prob -= (model.m_bit_0_prob >> cSymbolCodecArithProbMoveBits);
         m_arith_value  -= x;
         m_arith_length -= x;
      }

      return bit;
   }